

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O0

void __thiscall Atari2600::TIA::set_colour_palette_entry(TIA *this,size_t index,uint8_t colour)

{
  reference pvVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *target;
  int direction;
  uint8_t phase;
  uint8_t luminance;
  uint8_t colour_local;
  size_t index_local;
  TIA *this_local;
  
  uVar3 = (int)(uint)colour >> 4;
  bVar2 = (byte)uVar3;
  if (this->tv_standard_ == NTSC) {
    if (bVar2 == 0) {
      target._5_1_ = 0xff;
    }
    else {
      target._5_1_ = (char)((int)(uVar3 * -0x7f) / 0xd) + 0x9aU & 0x7f;
    }
  }
  else if ((bVar2 < 2) || (0xd < bVar2)) {
    target._5_1_ = 0xff;
  }
  else {
    target._5_1_ = (byte)((int)(uint)colour >> 5);
    if ((uVar3 & 1) != 0) {
      target._5_1_ = target._5_1_ ^ 0xf;
    }
    target._5_1_ = (byte)((ulong)((uint)(target._5_1_ + 6 + (char)(uVar3 & 1) & 0xf) * 0x7f) / 0xc)
                   & 0x7f;
  }
  pvVar1 = std::array<Atari2600::TIA::Colour,_4UL>::operator[](&this->colour_palette_,index);
  pvVar1->original = colour;
  pvVar1 = std::array<Atari2600::TIA::Colour,_4UL>::operator[](&this->colour_palette_,index);
  *(char *)&pvVar1->luminance_phase = (char)((ulong)((colour & 0xe) * 0xff) / 0xe);
  *(byte *)((long)&pvVar1->luminance_phase + 1) = target._5_1_;
  return;
}

Assistant:

void TIA::set_colour_palette_entry(size_t index, uint8_t colour) {
	const uint8_t luminance = ((colour & 14) * 255) / 14;

	uint8_t phase = colour >> 4;

	if(tv_standard_ == OutputMode::NTSC) {
		if(!phase) phase = 255;
		else {
			phase = -(phase * 127) / 13;
			phase -= 102;
			phase &= 127;
		}
	} else {
		if(phase < 2 || phase > 13) {
			phase = 255;
		} else {
			const auto direction = phase & 1;

			phase >>= 1;
			if(direction) phase ^= 0xf;
			phase = (phase + 6 + direction) & 0xf;

			phase = (phase * 127) / 12;
			phase &= 127;
		}
	}

	colour_palette_[index].original = colour;
	uint8_t *target = reinterpret_cast<uint8_t *>(&colour_palette_[index].luminance_phase);
	target[0] = luminance;
	target[1] = phase;
}